

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::ScanLineInputFile::rawPixelData
          (ScanLineInputFile *this,int firstScanLine,char **pixelData,int *pixelDataSize)

{
  Data *pDVar1;
  int minY;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar1 = this->_data;
  if ((pDVar1->minY <= firstScanLine) && (firstScanLine <= pDVar1->maxY)) {
    minY = lineBufferMinY(firstScanLine,pDVar1->minY,pDVar1->linesInBuffer);
    anon_unknown_7::readPixelData
              (this->_streamData,this->_data,minY,
               &((*(this->_data->lineBuffers).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->buffer)._data,pixelDataSize);
    *pixelData = ((*(this->_data->lineBuffers).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start)->buffer)._data;
    IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
ScanLineInputFile::rawPixelData (int firstScanLine,
				 const char *&pixelData,
				 int &pixelDataSize)
{
    try
    {
        Lock lock (*_streamData);

	if (firstScanLine < _data->minY || firstScanLine > _data->maxY)
	{
	    throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
			       "the image file's data window.");
	}

        int minY = lineBufferMinY
	    (firstScanLine, _data->minY, _data->linesInBuffer);

	readPixelData
	    (_streamData, _data, minY, _data->lineBuffers[0]->buffer, pixelDataSize);

	pixelData = _data->lineBuffers[0]->buffer;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}